

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFLogger.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_33e7d7::Pl_Track::Pl_Track(Pl_Track *this,char *identifier,Pipeline *next)

{
  logic_error *this_00;
  Pipeline *next_local;
  char *identifier_local;
  Pl_Track *this_local;
  
  Pipeline::Pipeline(&this->super_Pipeline,identifier,next);
  (this->super_Pipeline)._vptr_Pipeline = (_func_int **)&PTR__Pl_Track_0058f398;
  this->used = false;
  if (next == (Pipeline *)0x0) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this_00,"Attempt to create Pl_Track with nullptr as next");
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  return;
}

Assistant:

Pl_Track(char const* identifier, Pipeline* next) :
            Pipeline(identifier, next)
        {
            if (!next) {
                throw std::logic_error("Attempt to create Pl_Track with nullptr as next");
            }
        }